

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::ParseSymbolsFromSymbolTable<nlist>
               (LoadCommand *cmd,SymbolTable *table,RangeSink *sink)

{
  uint uVar1;
  symtab_command *psVar2;
  nlist *pnVar3;
  ulong off;
  size_t in_R8;
  uint32_t uVar4;
  bool bVar5;
  string_view sVar6;
  string_view sVar7;
  string_view data;
  string_view data_00;
  string_view symbol;
  string_view file_range;
  string_view file_range_00;
  char *local_80;
  bloaty *local_78;
  string_view local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string_view name_region;
  string_view symtab;
  
  sVar6._M_str = (char *)sink;
  sVar6._M_len = (size_t)(cmd->command_data)._M_str;
  psVar2 = GetStructPointer<symtab_command>((macho *)(cmd->command_data)._M_len,sVar6);
  sVar7._M_str._0_4_ = psVar2->symoff;
  sVar7._M_len = (size_t)(cmd->file_data)._M_str;
  sVar7._M_str._4_4_ = 0;
  symtab = StrictSubstr((bloaty *)(cmd->file_data)._M_len,sVar7,(ulong)psVar2->nsyms * 0xc,in_R8);
  off = (ulong)psVar2->strsize;
  data._M_str._0_4_ = psVar2->stroff;
  data._M_len = (size_t)(cmd->file_data)._M_str;
  data._M_str._4_4_ = 0;
  sVar6 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data,off,in_R8);
  uVar4 = psVar2->nsyms;
  while( true ) {
    local_80 = sVar6._M_str;
    local_78 = (bloaty *)sVar6._M_len;
    bVar5 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar5) break;
    pnVar3 = GetStructPointerAndAdvance<nlist>(&symtab);
    if ((pnVar3->n_type < 0x20) && (pnVar3->n_value != 0)) {
      data_00._M_str._0_4_ = (pnVar3->n_un).n_strx;
      data_00._M_len = (size_t)local_80;
      data_00._M_str._4_4_ = 0;
      name_region = StrictSubstr(local_78,data_00,off);
      sVar7 = ReadNullTerminated(&name_region);
      symbol._M_len = sVar7._M_str;
      if (6 < (int)sink->data_source_) {
        uVar1 = pnVar3->n_value;
        symbol._M_str._0_4_ = sink->data_source_;
        symbol._M_str._4_4_ = 0;
        ItaniumDemangle_abi_cxx11_
                  ((string *)&local_70,(bloaty *)sVar7._M_len,symbol,(DataSource)sVar7._M_str);
        RangeSink::AddVMRange
                  (sink,"macho_symbols",(ulong)uVar1,0xffffffffffffffff,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if (table != (SymbolTable *)0x0) {
        local_60._M_allocated_capacity._0_4_ = pnVar3->n_value;
        local_60._8_8_ = 0xffffffffffffffff;
        local_70 = sVar7;
        std::
        _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
        ::
        _M_emplace_unique<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_int,unsigned_long>>>
                  ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                    *)table,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_int,_unsigned_long>_>
                             *)&local_70);
      }
      file_range._M_str = symbol._M_len;
      file_range._M_len = (size_t)((bloaty *)sVar7._M_len + 1);
      RangeSink::AddFileRangeForVMAddr(sink,"macho_symtab_name",(ulong)pnVar3->n_value,file_range);
      off = 0xc;
      file_range_00._M_str = (char *)pnVar3;
      file_range_00._M_len = 0xc;
      RangeSink::AddFileRangeForVMAddr(sink,"macho_symtab_sym",(ulong)pnVar3->n_value,file_range_00)
      ;
    }
  }
  return;
}

Assistant:

void ParseSymbolsFromSymbolTable(const LoadCommand& cmd, SymbolTable* table,
                                 RangeSink* sink) {
  auto symtab_cmd = GetStructPointer<symtab_command>(cmd.command_data);

  string_view symtab = StrictSubstr(cmd.file_data, symtab_cmd->symoff,
                                    symtab_cmd->nsyms * sizeof(NList));
  string_view strtab =
      StrictSubstr(cmd.file_data, symtab_cmd->stroff, symtab_cmd->strsize);

  uint32_t nsyms = symtab_cmd->nsyms;
  for (uint32_t i = 0; i < nsyms; i++) {
    auto sym = GetStructPointerAndAdvance<NList>(&symtab);
    string_view sym_range(reinterpret_cast<const char*>(sym), sizeof(NList));

    if (sym->n_type & N_STAB || sym->n_value == 0) {
      continue;
    }

    string_view name_region = StrictSubstr(strtab, sym->n_un.n_strx);
    string_view name = ReadNullTerminated(&name_region);

    if (sink->data_source() >= DataSource::kSymbols) {
      sink->AddVMRange("macho_symbols", sym->n_value, RangeSink::kUnknownSize,
                       ItaniumDemangle(name, sink->data_source()));
    }

    if (table) {
      table->insert(std::make_pair(
          name, std::make_pair(sym->n_value, RangeSink::kUnknownSize)));
    }

    // Capture the trailing NULL.
    name = string_view(name.data(), name.size() + 1);
    sink->AddFileRangeForVMAddr("macho_symtab_name", sym->n_value, name);
    sink->AddFileRangeForVMAddr("macho_symtab_sym", sym->n_value, sym_range);
  }
}